

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

int comex_destroy_mutexes(void)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((l_state.num_mutexes != 0) && (l_state.mutexes == (int *)0x0)) {
    __assert_fail("0 == l_state.num_mutexes || NULL != l_state.mutexes",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x7fb,"int comex_destroy_mutexes()");
  }
  comex_barrier(0);
  do {
    comex_make_progress();
    uVar3 = 0;
    if (0 < l_state.num_mutexes) {
      uVar3 = (ulong)(uint)l_state.num_mutexes;
    }
    iVar2 = 0;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = iVar2 - (~l_state.mutexes[uVar4] >> 0x1f);
    }
  } while ((l_state.lq_head != (comex_lock_t *)0x0) || (iVar2 != 0));
  if (l_state.lq_tail == (comex_lock_t *)0x0) {
    uVar3 = 0;
    uVar4 = (ulong)(uint)l_state.num_mutexes;
    if (l_state.num_mutexes < 1) {
      uVar4 = uVar3;
    }
    do {
      if (uVar4 == uVar3) {
        l_state.num_mutexes = 0;
        free(l_state.mutexes);
        l_state.mutexes = (int *)0x0;
        return 0;
      }
      piVar1 = l_state.mutexes + uVar3;
      uVar3 = uVar3 + 1;
    } while (*piVar1 < 0);
    __assert_fail("l_state.mutexes[i] < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x813,"int comex_destroy_mutexes()");
  }
  __assert_fail("NULL == l_state.lq_tail",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x80e,"int comex_destroy_mutexes()");
}

Assistant:

int comex_destroy_mutexes()
{
    int number_of_outstanding_locks = 0;

    /* make sure mutexes were previously created */
    assert(0 == l_state.num_mutexes || NULL != l_state.mutexes);

    /* fix race condition -- some procs reach destroy before servicing all
     * requests */
    comex_barrier(COMEX_GROUP_WORLD);

    /* you cannot free mutexes if one is in use or queued for use */
    do {
        int m;
        comex_make_progress();
        number_of_outstanding_locks = 0;
        for (m=0; m<l_state.num_mutexes; ++m) {
            if (l_state.mutexes[m] >= 0) {
                ++number_of_outstanding_locks;
            }
        }
    } while (l_state.lq_head || number_of_outstanding_locks > 0);

    assert(NULL == l_state.lq_head);
    assert(NULL == l_state.lq_tail);
#ifndef NDEBUG
    {
        int i;
        for (i=0; i<l_state.num_mutexes; ++i) {
            assert(l_state.mutexes[i] < 0);
        }
    }
#endif

    /* destroy mutex counts */
    l_state.num_mutexes = 0;

    /* destroy the mutexes */
    _my_free(l_state.mutexes);
    l_state.mutexes = NULL;

    return COMEX_SUCCESS;
}